

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clSetKernelArgMemPointerINTEL(cl_kernel kernel,cl_uint arg_index,void *arg_value)

{
  uint64_t enqueueCounter;
  CLIntercept *this;
  byte bVar1;
  cl_int errorCode;
  CLdispatchX *pCVar2;
  time_point end;
  allocator local_61;
  time_point local_60;
  uint64_t local_58;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x30;
  }
  pCVar2 = CLIntercept::dispatchX(g_pIntercept,kernel);
  if (pCVar2->clSetKernelArgMemPointerINTEL == (_func_cl_int_cl_kernel_cl_uint_void_ptr *)0x0) {
    return -0x30;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingEnter
              (this,"clSetKernelArgMemPointerINTEL",enqueueCounter,kernel,
               "kernel = %p, index = %u, value = %p",kernel,(ulong)arg_index,arg_value);
  }
  if ((this->m_Config).USMChecking == true) {
    CLIntercept::checkKernelArgUSMPointer(this,kernel,arg_value);
  }
  if (((((this->m_Config).DumpBuffersBeforeEnqueue != false) ||
       ((this->m_Config).DumpBuffersAfterEnqueue != false)) ||
      ((this->m_Config).InjectBuffers != false)) ||
     (((this->m_Config).InjectImages != false || ((this->m_Config).CaptureReplay == true)))) {
    CLIntercept::setKernelArgUSMPointer(this,kernel,arg_index,arg_value);
  }
  local_58 = enqueueCounter;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_60.__d.__r = (duration)0;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pCVar2->clSetKernelArgMemPointerINTEL)(kernel,arg_index,arg_value);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_58 &&
        (local_58 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_61);
      CLIntercept::updateHostTimingStats
                (this,"clSetKernelArgMemPointerINTEL",&local_50,local_60,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar1 = (this->m_Config).ErrorAssert;
    if ((bool)bVar1 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_001357e1;
    }
    else if (errorCode == 0) goto LAB_001357b8;
  }
  else {
    if (errorCode == 0) {
LAB_001357b8:
      errorCode = 0;
      goto LAB_001357e1;
    }
    CLIntercept::logError(this,"clSetKernelArgMemPointerINTEL",errorCode);
    bVar1 = (this->m_Config).ErrorAssert;
  }
  if ((bVar1 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_001357e1:
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clSetKernelArgMemPointerINTEL",errorCode,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_61);
    CLIntercept::chromeCallLoggingExit
              (this,"clSetKernelArgMemPointerINTEL",&local_50,false,0,local_60,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clSetKernelArgMemPointerINTEL(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(kernel);
        if( dispatchX.clSetKernelArgMemPointerINTEL )
        {
            GET_ENQUEUE_COUNTER();
            CALL_LOGGING_ENTER_KERNEL(
                kernel,
                "kernel = %p, index = %u, value = %p",
                kernel,
                arg_index,
                arg_value );
            CHECK_KERNEL_ARG_USM_POINTER( kernel, arg_value );
            SET_KERNEL_ARG_USM_POINTER( kernel, arg_index, arg_value );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clSetKernelArgMemPointerINTEL(
                kernel,
                arg_index,
                arg_value );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_KERNEL);
}